

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string * __thiscall
vera::toString_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,vec3 *_vec,char _sep,int _precision)

{
  _Setprecision _Var1;
  ostream *poVar2;
  undefined3 in_register_00000009;
  int __n;
  ostringstream local_198 [8];
  ostringstream strStream;
  int _precision_local;
  char _sep_local;
  vec3 *_vec_local;
  
  __n = CONCAT31(in_register_00000009,_sep);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setprecision(__n);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)this);
  std::operator<<(poVar2,(char)_vec);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setprecision(__n);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(this + 4));
  std::operator<<(poVar2,(char)_vec);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setprecision(__n);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,*(float *)(this + 8));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const glm::vec3& _vec, char _sep, int _precision) {
    std::ostringstream strStream;
    strStream << std::fixed << std::setprecision(_precision) << _vec.x << _sep;
    strStream << std::fixed << std::setprecision(_precision) << _vec.y << _sep; 
    strStream << std::fixed << std::setprecision(_precision) << _vec.z;
    return strStream.str();
}